

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixEigenExtensions.h
# Opt level: O3

void __thiscall
Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
ArchiveOUT(MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           *this,ChArchiveOut *marchive)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ChValueSpecific<double_*> specVal;
  double *foo;
  size_t m_col;
  size_t m_row;
  char idname [21];
  char *local_b0;
  long local_a8;
  undefined1 local_a0;
  ChValueSpecific<double_*> local_98;
  double *local_60;
  char local_58 [8];
  undefined8 local_50;
  char local_48 [24];
  
  chrono::ChArchiveOut::VersionWrite<chrono::ChMatrix_dense_version_tag>(marchive);
  lVar1 = __dynamic_cast(marchive,&chrono::ChArchiveOut::typeinfo,
                         &chrono::ChArchiveAsciiDump::typeinfo,0);
  if (lVar1 == 0) {
    local_50 = *(undefined8 *)(this + 8);
    local_98.super_ChValue._name._M_dataplus._M_p = (pointer)&local_50;
    local_98.super_ChValue._vptr_ChValue = (_func_int **)0x12b59b;
    local_58[0] = '\x01';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_98.super_ChValue._name._M_string_length._0_1_ = 0;
    (*(marchive->super_ChArchive)._vptr_ChArchive[9])(marchive,&local_98);
    local_98.super_ChValue._vptr_ChValue = (_func_int **)0x12b5a0;
    local_98.super_ChValue._name._M_string_length._0_1_ = 0;
    local_98.super_ChValue._name._M_dataplus._M_p = local_58;
    (*(marchive->super_ChArchive)._vptr_ChArchive[9])(marchive,&local_98);
    lVar1 = *(long *)(this + 8);
    local_60 = (double *)0x0;
    chrono::ChValueSpecific<double_*>::ChValueSpecific(&local_98,&local_60,"data",'\0');
    (*(marchive->super_ChArchive)._vptr_ChArchive[0xe])(marchive,&local_98,lVar1);
    if (lVar1 != 0) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        sprintf(local_48,"%lu",lVar4);
        if (*(long *)(this + 8) <= lVar4) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                       );
        }
        local_a8 = *(long *)this + lVar3;
        local_a0 = 0;
        local_b0 = local_48;
        (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_b0);
        (*(marchive->super_ChArchive)._vptr_ChArchive[0xf])(marchive,&local_98,lVar1);
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 8;
      } while (lVar1 != lVar4);
    }
    (*(marchive->super_ChArchive)._vptr_ChArchive[0x10])(marchive,&local_98,lVar1);
    local_98.super_ChValue._vptr_ChValue = (_func_int **)&PTR__ChValue_001359e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.super_ChValue._name._M_dataplus._M_p != &local_98.super_ChValue._name.field_2) {
      operator_delete(local_98.super_ChValue._name._M_dataplus._M_p,
                      local_98.super_ChValue._name.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (0 < *(int *)(lVar1 + 0x104)) {
      iVar2 = 0;
      do {
        chrono::ChStreamOutAscii::operator<<(*(ChStreamOutAscii **)(lVar1 + 0x108),"\t");
        iVar2 = iVar2 + 1;
      } while (iVar2 < *(int *)(lVar1 + 0x104));
    }
    chrono::ChStreamOutAscii::operator<<(*(ChStreamOutAscii **)(lVar1 + 0x108),*(int *)(this + 8));
    chrono::ChStreamOutAscii::operator<<(*(ChStreamOutAscii **)(lVar1 + 0x108)," rows,  ");
    chrono::ChStreamOutAscii::operator<<(*(ChStreamOutAscii **)(lVar1 + 0x108),1);
    chrono::ChStreamOutAscii::operator<<(*(ChStreamOutAscii **)(lVar1 + 0x108)," columns:\n");
    lVar4 = *(long *)(this + 8);
    if (0 < lVar4) {
      lVar3 = 0;
      do {
        if (0 < *(int *)(lVar1 + 0x104)) {
          iVar2 = 0;
          do {
            chrono::ChStreamOutAscii::operator<<(*(ChStreamOutAscii **)(lVar1 + 0x108),"\t");
            iVar2 = iVar2 + 1;
          } while (iVar2 < *(int *)(lVar1 + 0x104));
          lVar4 = *(long *)(this + 8);
        }
        if (lVar4 <= lVar3) {
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                       );
        }
        chrono::ChStreamOutAscii::operator<<
                  (*(ChStreamOutAscii **)(lVar1 + 0x108),*(double *)(*(long *)this + lVar3 * 8));
        chrono::ChStreamOutAscii::operator<<(*(ChStreamOutAscii **)(lVar1 + 0x108),", ");
        chrono::ChStreamOutAscii::operator<<(*(ChStreamOutAscii **)(lVar1 + 0x108),"\n");
        lVar4 = *(long *)(this + 8);
        lVar3 = lVar3 + 1;
      } while (lVar3 < lVar4);
    }
  }
  return;
}

Assistant:

void ArchiveOUT(chrono::ChArchiveOut& marchive) {
    // suggested: use versioning
	marchive.VersionWrite<chrono::ChMatrix_dense_version_tag>(); // btw use the ChMatrixDynamic version tag also for all other templates.

    // stream out all member data

    if (chrono::ChArchiveAsciiDump* mascii = dynamic_cast<chrono::ChArchiveAsciiDump*>(&marchive)) {
        // CUSTOM row x col 'intuitive' table-like log when using ChArchiveAsciiDump:
        mascii->indent();
        mascii->GetStream()->operator<<((int)derived().rows());
        mascii->GetStream()->operator<<(" rows,  ");
        mascii->GetStream()->operator<<((int)derived().cols());
        mascii->GetStream()->operator<<(" columns:\n");
        for (int i = 0; i < derived().rows(); i++) {
            mascii->indent();
            for (int j = 0; j < derived().cols(); j++) {
                (*mascii->GetStream()) << derived()(i, j);
                mascii->GetStream()->operator<<(", ");
            }
            mascii->GetStream()->operator<<("\n");
        }
    } else {
        size_t m_row = derived().rows();
		size_t m_col = derived().cols();
        marchive << chrono::make_ChNameValue("rows", m_row);
        marchive << chrono::make_ChNameValue("columns", m_col);
         
        // NORMAL array-based serialization:
        size_t tot_elements = derived().rows() *  derived().cols();
		double* foo = 0;
        chrono::ChValueSpecific< double* > specVal(foo, "data", 0);
        marchive.out_array_pre(specVal, tot_elements);
		char idname[21]; // only for xml, xml serialization needs unique element name
        for (size_t i = 0; i < tot_elements; i++) {
			sprintf(idname, "%lu", (unsigned long)i);
            marchive << chrono::CHNVP(derived()((Eigen::Index)i), idname);
            marchive.out_array_between(specVal, tot_elements);
        }
        marchive.out_array_end(specVal, tot_elements);
    }
}